

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetDefaultPayloadType(RTPSession *this,uint8_t pt)

{
  int status;
  uint8_t pt_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTPPacketBuilder::SetDefaultPayloadType(&this->packetbuilder,pt);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetDefaultPayloadType(uint8_t pt)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;
	
	int status;
	
	BUILDER_LOCK
	status = packetbuilder.SetDefaultPayloadType(pt);
	BUILDER_UNLOCK
	return status;
}